

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O0

terminal_color __thiscall
slang::TextDiagnosticClient::getSeverityColor
          (TextDiagnosticClient *this,DiagnosticSeverity severity)

{
  DiagnosticSeverity severity_local;
  TextDiagnosticClient *this_local;
  terminal_color local_1;
  
  switch(severity) {
  case Note:
    local_1 = (this->super_DiagnosticClient).field_0x19;
    break;
  case Warning:
    local_1 = (this->super_DiagnosticClient).field_0x1a;
    break;
  case Error:
    local_1 = (this->super_DiagnosticClient).field_0x1b;
    break;
  case Fatal:
    local_1 = (this->super_DiagnosticClient).field_0x1c;
    break;
  default:
    local_1 = black;
  }
  return local_1;
}

Assistant:

fmt::terminal_color TextDiagnosticClient::getSeverityColor(DiagnosticSeverity severity) const {
    switch (severity) {
        case DiagnosticSeverity::Note:
            return noteColor;
        case DiagnosticSeverity::Warning:
            return warningColor;
        case DiagnosticSeverity::Error:
            return errorColor;
        case DiagnosticSeverity::Fatal:
            return fatalColor;
        default:
            return fmt::terminal_color::black;
    }
}